

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_blockcb.c
# Opt level: O1

rfc5444_result cb_blocktlv_packet(rfc5444_reader_tlvblock_context *cont,_Bool mandatory_missing)

{
  rfc5444_result rVar1;
  
  got_tlv_0 = consumer_entries[0].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  if (consumer_entries[0].tlv == (rfc5444_reader_tlvblock_entry *)0x0) {
    got_multiple_times_0 = false;
  }
  else {
    got_multiple_times_0 =
         (consumer_entries[0].tlv)->next_entry != (rfc5444_reader_tlvblock_entry *)0x0;
  }
  got_tlv_1 = consumer_entries[1].tlv != (rfc5444_reader_tlvblock_entry *)0x0;
  if (consumer_entries[1].tlv == (rfc5444_reader_tlvblock_entry *)0x0) {
    rVar1 = RFC5444_OKAY;
  }
  else {
    rVar1 = (rfc5444_result)
            CONCAT71((int7)((ulong)consumer_entries[1].tlv >> 8),
                     (consumer_entries[1].tlv)->next_entry != (rfc5444_reader_tlvblock_entry *)0x0);
  }
  got_multiple_times_1 = (char)rVar1;
  got_failed_constraints = (_Bool)(char)cont;
  return rVar1;
}

Assistant:

static enum rfc5444_result
cb_blocktlv_packet(struct rfc5444_reader_tlvblock_context *cont __attribute__ ((unused)),
      bool mandatory_missing) {
  got_tlv[0] = consumer_entries[0].tlv != NULL;
  got_multiple_times[0] = got_tlv[0] && consumer_entries[0].tlv->next_entry != NULL;

  got_tlv[1] = consumer_entries[1].tlv != NULL;
  got_multiple_times[1] = got_tlv[1] && consumer_entries[1].tlv->next_entry != NULL;

  got_failed_constraints = mandatory_missing;
  return RFC5444_OKAY;
}